

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64 *value)

{
  uint8 *puVar1;
  byte bVar2;
  pair<unsigned_long,_bool> pVar3;
  
  puVar1 = this->buffer_;
  if ((puVar1 < this->buffer_end_) && (-1 < (long)(char)*puVar1)) {
    *value = (long)(char)*puVar1;
    this->buffer_ = puVar1 + 1;
    bVar2 = 1;
  }
  else {
    pVar3 = ReadVarint64Fallback(this);
    bVar2 = pVar3.second;
    *value = pVar3.first;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

inline bool CodedInputStream::ReadVarint64(uint64* value) {
  if (PROTOBUF_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  }
  std::pair<uint64, bool> p = ReadVarint64Fallback();
  *value = p.first;
  return p.second;
}